

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_set_list_item(AMQP_VALUE value,uint32_t index,AMQP_VALUE list_item_value)

{
  undefined1 auVar1 [16];
  LOGGER_LOG p_Var2;
  AMQP_VALUE value_00;
  void *pvVar3;
  AMQP_VALUE pAVar4;
  size_t local_98;
  size_t local_90;
  ulong local_88;
  uint local_7c;
  uint32_t j;
  LOGGER_LOG l_4;
  uint32_t i;
  LOGGER_LOG l_3;
  size_t realloc_size;
  AMQP_VALUE *new_list;
  LOGGER_LOG l_2;
  AMQP_VALUE cloned_item;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE list_item_value_local;
  uint32_t index_local;
  AMQP_VALUE value_local;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_set_list_item",0x571,1,"NULL list value");
    }
    l._4_4_ = 0x572;
  }
  else if (value->type == AMQP_TYPE_LIST) {
    value_00 = amqpvalue_clone(list_item_value);
    if (value_00 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_set_list_item",0x584,1,"Could not clone list item");
      }
      l._4_4_ = 0x585;
    }
    else if (index < (value->value).binary_value.length) {
      amqpvalue_destroy(*(AMQP_VALUE *)
                         (&((value->value).described_value.descriptor)->type + (ulong)index * 2));
      *(AMQP_VALUE *)(&((value->value).described_value.descriptor)->type + (ulong)index * 2) =
           value_00;
      l._4_4_ = 0;
    }
    else {
      if ((ulong)index < 0xfffffffffffffffe) {
        local_88 = (ulong)index + 1;
      }
      else {
        local_88 = 0xffffffffffffffff;
      }
      if (local_88 == 0) {
        local_90 = 0;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_88;
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 8) {
          local_98 = 0xffffffffffffffff;
        }
        else {
          local_98 = local_88 << 3;
        }
        local_90 = local_98;
      }
      if ((local_90 == 0xffffffffffffffff) ||
         (pvVar3 = realloc((value->value).binary_value.bytes,local_90), pvVar3 == (void *)0x0)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_set_list_item",0x592,1,"Could not reallocate list storage, size:%zu"
                    ,local_90);
        }
        amqpvalue_destroy(value_00);
        l._4_4_ = 0x594;
      }
      else {
        (value->value).binary_value.bytes = pvVar3;
        for (l_4._4_4_ = (value->value).binary_value.length; l_4._4_4_ < index;
            l_4._4_4_ = l_4._4_4_ + 1) {
          pAVar4 = amqpvalue_create_null();
          *(AMQP_VALUE *)((long)pvVar3 + (ulong)l_4._4_4_ * 8) = pAVar4;
          if (*(long *)((long)pvVar3 + (ulong)l_4._4_4_ * 8) == 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                        ,"amqpvalue_set_list_item",0x5a1,1,
                        "Could not allocate NULL value for list entries");
            }
            break;
          }
        }
        if (l_4._4_4_ < index) {
          for (local_7c = (value->value).binary_value.length; local_7c < l_4._4_4_;
              local_7c = local_7c + 1) {
            amqpvalue_destroy(*(AMQP_VALUE *)((long)pvVar3 + (ulong)local_7c * 8));
          }
          amqpvalue_destroy(value_00);
          l._4_4_ = 0x5b3;
        }
        else {
          (value->value).binary_value.length = index + 1;
          *(AMQP_VALUE *)(&((value->value).described_value.descriptor)->type + (ulong)index * 2) =
               value_00;
          l._4_4_ = 0;
        }
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_set_list_item",0x579,1,"Value is not of type LIST");
    }
    l._4_4_ = 0x57a;
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_set_list_item(AMQP_VALUE value, uint32_t index, AMQP_VALUE list_item_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_165: [If value or list_item_value is NULL, amqpvalue_set_list_item shall fail and return a non-zero value.] */
    if (value == NULL)
    {
        LogError("NULL list value");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if (value_data->type != AMQP_TYPE_LIST)
        {
            LogError("Value is not of type LIST");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_168: [The item stored at the index-th position in the list shall be a clone of list_item_value.] */
            AMQP_VALUE cloned_item = amqpvalue_clone(list_item_value);
            if (cloned_item == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_170: [When amqpvalue_set_list_item fails due to not being able to clone the item or grow the list, the list shall not be altered.] */
                /* Codes_SRS_AMQPVALUE_01_169: [If cloning the item fails, amqpvalue_set_list_item shall fail and return a non-zero value.] */
                LogError("Could not clone list item");
                result = MU_FAILURE;
            }
            else
            {
                if (index >= value_data->value.list_value.count)
                {
                    AMQP_VALUE* new_list;
                    size_t realloc_size = safe_add_size_t((size_t)index, 1);
                    realloc_size = safe_multiply_size_t(realloc_size, sizeof(AMQP_VALUE));
                    if (realloc_size == SIZE_MAX ||
                        (new_list = (AMQP_VALUE*)realloc(value_data->value.list_value.items, realloc_size)) == NULL)
                    {
                        /* Codes_SRS_AMQPVALUE_01_170: [When amqpvalue_set_list_item fails due to not being able to clone the item or grow the list, the list shall not be altered.] */
                        LogError("Could not reallocate list storage, size:%zu", realloc_size);
                        amqpvalue_destroy(cloned_item);
                        result = MU_FAILURE;
                    }
                    else
                    {
                        uint32_t i;

                        value_data->value.list_value.items = new_list;

                        for (i = value_data->value.list_value.count; i < index; i++)
                        {
                            new_list[i] = amqpvalue_create_null();
                            if (new_list[i] == NULL)
                            {
                                LogError("Could not allocate NULL value for list entries");
                                break;
                            }
                        }

                        if (i < index)
                        {
                            /* Codes_SRS_AMQPVALUE_01_170: [When amqpvalue_set_list_item fails due to not being able to clone the item or grow the list, the list shall not be altered.] */
                            uint32_t j;

                            for (j = value_data->value.list_value.count; j < i; j++)
                            {
                                amqpvalue_destroy(new_list[j]);
                            }

                            amqpvalue_destroy(cloned_item);

                            /* Codes_SRS_AMQPVALUE_01_172: [If growing the list fails, then amqpvalue_set_list_item shall fail and return a non-zero value.] */
                            result = MU_FAILURE;
                        }
                        else
                        {
                            value_data->value.list_value.count = index + 1;
                            value_data->value.list_value.items[index] = cloned_item;

                            /* Codes_SRS_AMQPVALUE_01_164: [On success amqpvalue_set_list_item shall return 0.] */
                            result = 0;
                        }
                    }
                }
                else
                {
                    /* Codes_SRS_AMQPVALUE_01_167: [Any previous value stored at the position index in the list shall be freed by using amqpvalue_destroy.] */
                    amqpvalue_destroy(value_data->value.list_value.items[index]);

                    /* Codes_SRS_AMQPVALUE_01_163: [amqpvalue_set_list_item shall replace the item at the 0 based index-th position in the list identified by the value argument with the AMQP_VALUE specified by list_item_value.] */
                    value_data->value.list_value.items[index] = cloned_item;

                    /* Codes_SRS_AMQPVALUE_01_164: [On success amqpvalue_set_list_item shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}